

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.hpp
# Opt level: O0

intrusive_ptr<boost::xpressive::detail::finder<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
 boost::xpressive::detail::
 optimize_regex<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
           (finder<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *param_1,xpression_peeker<char> *param_2)

{
  bool bVar1;
  finder<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *p;
  void *pvVar2;
  size_t sVar3;
  hash_peek_finder<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
  *this;
  hash_peek_bitset<char> *in_stack_ffffffffffffff98;
  leading_simple_repeat_finder<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffa0;
  undefined8 in_stack_ffffffffffffffb0;
  undefined1 uVar4;
  finder<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffb8;
  finder<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *tr;
  line_start_finder<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_1UL>
  *in_stack_ffffffffffffffd0;
  
  uVar4 = (undefined1)((ulong)in_stack_ffffffffffffffb0 >> 0x38);
  tr = param_1;
  bVar1 = xpression_peeker<char>::line_start(param_2);
  if (bVar1) {
    p = (finder<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)operator_new(0x110);
    line_start_finder<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_1UL>
    ::line_start_finder(in_stack_ffffffffffffffd0,
                        (regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_> *)tr);
    intrusive_ptr<boost::xpressive::detail::finder<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::intrusive_ptr((intrusive_ptr<boost::xpressive::detail::finder<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)param_1,p,(bool)uVar4);
  }
  else {
    bVar1 = xpression_peeker<char>::leading_simple_repeat(param_2);
    if (bVar1) {
      pvVar2 = operator_new(0x10);
      uVar4 = (undefined1)((ulong)pvVar2 >> 0x38);
      leading_simple_repeat_finder<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::leading_simple_repeat_finder(in_stack_ffffffffffffffa0);
      intrusive_ptr<boost::xpressive::detail::finder<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::intrusive_ptr((intrusive_ptr<boost::xpressive::detail::finder<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)param_1,in_stack_ffffffffffffffb8,(bool)uVar4);
    }
    else {
      xpression_peeker<char>::bitset(param_2);
      sVar3 = hash_peek_bitset<char>::count((hash_peek_bitset<char> *)0x17f95b);
      if (sVar3 == 0x100) {
        intrusive_ptr<boost::xpressive::detail::finder<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::intrusive_ptr((intrusive_ptr<boost::xpressive::detail::finder<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)param_1);
      }
      else {
        this = (hash_peek_finder<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
                *)operator_new(0x38);
        xpression_peeker<char>::bitset(param_2);
        hash_peek_finder<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
        ::hash_peek_finder(this,in_stack_ffffffffffffff98);
        intrusive_ptr<boost::xpressive::detail::finder<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::intrusive_ptr((intrusive_ptr<boost::xpressive::detail::finder<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)param_1,in_stack_ffffffffffffffb8,(bool)uVar4);
      }
    }
  }
  return (intrusive_ptr<boost::xpressive::detail::finder<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          )tr;
}

Assistant:

intrusive_ptr<finder<BidiIter> > optimize_regex
(
    xpression_peeker<typename iterator_value<BidiIter>::type> const &peeker
  , Traits const &tr
  , mpl::false_
)
{
    if(peeker.line_start())
    {
        return intrusive_ptr<finder<BidiIter> >
        (
            new line_start_finder<BidiIter, Traits>(tr)
        );
    }
    else if(peeker.leading_simple_repeat())
    {
        return intrusive_ptr<finder<BidiIter> >
        (
            new leading_simple_repeat_finder<BidiIter>()
        );
    }
    else if(256 != peeker.bitset().count())
    {
        return intrusive_ptr<finder<BidiIter> >
        (
            new hash_peek_finder<BidiIter, Traits>(peeker.bitset())
        );
    }

    return intrusive_ptr<finder<BidiIter> >();
}